

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void __thiscall
cfd::core::FindPsbtMap
          (core *this,wally_map *map_object,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *key,string *field_name,
          size_t *index)

{
  CfdException *pCVar1;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int ret;
  size_t exist;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  int local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  
  local_28 = 0;
  local_4c = wally_map_find((wally_map *)this,(uchar *)map_object,(long)key - (long)map_object,
                            &local_28);
  if (local_4c != 0) {
    local_70._0_8_ = "cfdcore_psbt.cpp";
    local_70._8_4_ = 0x357;
    local_60._M_allocated_capacity = 0x5d9334;
    logger::log<int&>((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"wally_map_find NG[{}]",
                      &local_4c);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::operator+(&local_48,"psbt find ",field_name);
    plVar2 = (long *)::std::__cxx11::string::append((char *)&local_48);
    local_70._0_8_ = *plVar2;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._0_8_ == paVar3) {
      local_60._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_60._8_8_ = plVar2[3];
      local_70._0_8_ = &local_60;
    }
    else {
      local_60._M_allocated_capacity = paVar3->_M_allocated_capacity;
    }
    local_70._8_8_ = plVar2[1];
    *plVar2 = (long)paVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    CfdException::CfdException(pCVar1,kCfdInternalError,(string *)local_70);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (local_28 == 0 || index != (size_t *)0x0) {
    if (index != (size_t *)0x0) {
      if (local_28 == 0) {
        local_70._0_8_ = "cfdcore_psbt.cpp";
        local_70._8_4_ = 0x361;
        local_60._M_allocated_capacity = 0x5d9334;
        logger::log<std::__cxx11::string_const&>
                  ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"{} not found.",field_name);
        pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::operator+(&local_48,"psbt ",field_name);
        plVar2 = (long *)::std::__cxx11::string::append((char *)&local_48);
        local_70._0_8_ = *plVar2;
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._0_8_ == paVar3) {
          local_60._M_allocated_capacity = paVar3->_M_allocated_capacity;
          local_60._8_8_ = plVar2[3];
          local_70._0_8_ = &local_60;
        }
        else {
          local_60._M_allocated_capacity = paVar3->_M_allocated_capacity;
        }
        local_70._8_8_ = plVar2[1];
        *plVar2 = (long)paVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_70);
        __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
      }
      *index = local_28 - 1;
    }
    return;
  }
  local_70._0_8_ = "cfdcore_psbt.cpp";
  local_70._8_4_ = 0x35c;
  local_60._M_allocated_capacity = 0x5d9334;
  logger::log<std::__cxx11::string_const&>
            ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"{} duplicates.",field_name);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::operator+(&local_48,"psbt ",field_name);
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_48);
  local_70._0_8_ = *plVar2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._0_8_ == paVar3) {
    local_60._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_60._8_8_ = plVar2[3];
    local_70._0_8_ = &local_60;
  }
  else {
    local_60._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_70._8_8_ = plVar2[1];
  *plVar2 = (long)paVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_70);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

static void FindPsbtMap(
    const struct wally_map *map_object, const std::vector<uint8_t> &key,
    const std::string &field_name, size_t *index = nullptr) {
  size_t exist = 0;
  int ret = wally_map_find(map_object, key.data(), key.size(), &exist);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_map_find NG[{}]", ret);
    throw CfdException(
        kCfdInternalError, "psbt find " + field_name + " error.");
  }
  if ((index == nullptr) && (exist != 0)) {
    warn(CFD_LOG_SOURCE, "{} duplicates.", field_name);
    throw CfdException(
        kCfdIllegalArgumentError, "psbt " + field_name + " duplicates error.");
  } else if (index != nullptr) {
    if (exist == 0) {
      warn(CFD_LOG_SOURCE, "{} not found.", field_name);
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt " + field_name + " not found error.");
    }
    *index = exist - 1;
  }
}